

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.h
# Opt level: O2

void __thiscall
llvm::MCSuperRegIterator::MCSuperRegIterator
          (MCSuperRegIterator *this,MCRegister Reg,MCRegisterInfo *MCRI,bool IncludeSelf)

{
  uint uVar1;
  MCPhysReg *pMVar2;
  MCRegisterDesc *pMVar3;
  undefined3 in_register_00000009;
  
  (this->super_DiffListIterator).Val = 0;
  (this->super_DiffListIterator).List = (MCPhysReg *)0x0;
  pMVar2 = MCRI->DiffLists;
  pMVar3 = MCRegisterInfo::operator[](MCRI,Reg);
  uVar1 = pMVar3->SuperRegs;
  (this->super_DiffListIterator).Val = (uint16_t)Reg.Reg;
  (this->super_DiffListIterator).List = pMVar2 + uVar1;
  if (CONCAT31(in_register_00000009,IncludeSelf) != 0) {
    return;
  }
  MCRegisterInfo::DiffListIterator::operator++(&this->super_DiffListIterator);
  return;
}

Assistant:

MCSuperRegIterator(MCRegister Reg, const MCRegisterInfo *MCRI,
                     bool IncludeSelf = false) {
    init(Reg, MCRI->DiffLists + MCRI->get(Reg).SuperRegs);
    // Initially, the iterator points to Reg itself.
    if (!IncludeSelf)
      ++*this;
  }